

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_err.c
# Opt level: O1

void lj_err_mem(lua_State *L)

{
  TValue *pTVar1;
  GCstr *pGVar2;
  ulong uVar3;
  
  if (L->status == '\x06') {
    lj_vm_unwind_c(L->cframe);
  }
  pTVar1 = (TValue *)(ulong)*(uint *)((ulong)(L->glref).ptr32 + 400);
  if (pTVar1 != (TValue *)0x0) {
    L->base = pTVar1;
  }
  uVar3 = (ulong)L->base[-1].u32.lo;
  if (*(char *)(uVar3 + 6) == '\0') {
    L->top = L->base + *(byte *)((ulong)*(uint *)(uVar3 + 0x10) - 0x39);
  }
  pTVar1 = L->top;
  L->top = pTVar1 + 1;
  pGVar2 = lj_err_str(L,LJ_ERR_ERRMEM);
  (pTVar1->u32).lo = (uint32_t)pGVar2;
  (pTVar1->field_2).it = 0xfffffffb;
  lj_err_throw(L,4);
}

Assistant:

LJ_NOINLINE void lj_err_mem(lua_State *L)
{
  if (L->status == LUA_ERRERR+1)  /* Don't touch the stack during lua_open. */
    lj_vm_unwind_c(L->cframe, LUA_ERRMEM);
  if (LJ_HASJIT) {
    TValue *base = tvref(G(L)->jit_base);
    if (base) L->base = base;
  }
  if (curr_funcisL(L)) L->top = curr_topL(L);
  setstrV(L, L->top++, lj_err_str(L, LJ_ERR_ERRMEM));
  lj_err_throw(L, LUA_ERRMEM);
}